

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O3

void secp256k1_ecmult(secp256k1_gej *r,secp256k1_gej *a,secp256k1_scalar *na,secp256k1_scalar *ng)

{
  uint64_t *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  ulong *puVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined4 in_EAX;
  int iVar65;
  uint uVar66;
  uint uVar67;
  ulong uVar68;
  ulong uVar69;
  long lVar70;
  long lVar71;
  secp256k1_gej *psVar72;
  secp256k1_ge *psVar73;
  secp256k1_ge *psVar74;
  ulong uVar75;
  secp256k1_ge *psVar76;
  ulong uVar77;
  uint *puVar78;
  uint uVar79;
  undefined1 *puVar80;
  long lVar81;
  byte bVar82;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  secp256k1_fe Z;
  secp256k1_fe aux [8];
  int wnaf_ng_128 [129];
  int wnaf_ng_1 [129];
  secp256k1_strauss_point_state ps [1];
  secp256k1_ge pre_a [8];
  ulong local_da8;
  long local_da0;
  long local_d98;
  long local_d90;
  secp256k1_gej *local_d70;
  undefined1 local_d58 [64];
  long lStack_d18;
  uint64_t local_d10;
  int local_d08;
  undefined1 local_cd8 [16];
  ulong uStack_cc8;
  undefined1 local_cc0 [16];
  undefined1 local_ca8 [16];
  undefined1 local_c98 [16];
  undefined1 local_c88 [32];
  secp256k1_fe local_c68 [7];
  uint uStack_b2c;
  secp256k1_scalar local_b28 [16];
  uint uStack_91c;
  secp256k1_gej local_918 [4];
  int local_708 [129];
  int local_504 [129];
  uint local_300;
  uint local_2fc;
  secp256k1_ge local_2f8 [8];
  
  bVar82 = 0;
  local_cd8._0_8_ = 1;
  stack0xfffffffffffff330 = (undefined1  [16])0x0;
  local_cc0 = (undefined1  [16])0x0;
  auVar83 = *(undefined1 (*) [16])(na->d + 2) | *(undefined1 (*) [16])na->d;
  auVar84._0_4_ = -(uint)(auVar83._0_4_ == 0);
  auVar84._4_4_ = -(uint)(auVar83._4_4_ == 0);
  auVar84._8_4_ = -(uint)(auVar83._8_4_ == 0);
  auVar84._12_4_ = -(uint)(auVar83._12_4_ == 0);
  iVar65 = movmskps(in_EAX,auVar84);
  local_d70 = r;
  if ((iVar65 == 0xf) || (a->infinity != 0)) {
    local_da0 = 0;
    local_da8 = CONCAT44(local_da8._4_4_,(int)CONCAT71((uint7)(uint3)((uint)iVar65 >> 8),1));
    uVar79 = 0;
  }
  else {
    secp256k1_scalar_split_lambda(local_b28,(secp256k1_scalar *)local_d58,na);
    local_300 = secp256k1_ecmult_wnaf(local_708,0x81,local_b28,5);
    local_2fc = secp256k1_ecmult_wnaf(local_504,0x81,(secp256k1_scalar *)local_d58,5);
    uVar79 = local_2fc;
    if ((int)local_2fc < (int)local_300) {
      uVar79 = local_300;
    }
    lVar81 = 0;
    if ((int)uVar79 < 1) {
      uVar79 = 0;
    }
    psVar72 = local_918;
    for (lVar71 = 0x10; lVar71 != 0; lVar71 = lVar71 + -1) {
      (psVar72->x).n[0] = (a->x).n[0];
      a = (secp256k1_gej *)((long)a + (ulong)bVar82 * -0x10 + 8);
      psVar72 = (secp256k1_gej *)((long)psVar72 + (ulong)bVar82 * -0x10 + 8);
    }
    psVar73 = local_2f8;
    secp256k1_ecmult_odd_multiples_table(8,psVar73,local_c68,(secp256k1_fe *)local_cd8,local_918);
    secp256k1_ge_table_set_globalz(8,psVar73,local_c68);
    do {
      secp256k1_fe_impl_mul
                ((secp256k1_fe *)((long)local_c68[0].n + lVar81),&psVar73->x,&secp256k1_const_beta);
      lVar81 = lVar81 + 0x28;
      psVar73 = psVar73 + 1;
    } while (lVar81 != 0x140);
    local_da0 = 1;
    local_da8 = local_da8 & 0xffffffff00000000;
  }
  psVar72 = local_d70;
  if (ng == (secp256k1_scalar *)0x0) {
    local_d90 = 0;
    local_d98 = 0;
  }
  else {
    local_c88._0_8_ = ng->d[0];
    local_c88._8_8_ = ng->d[1];
    local_c88._16_16_ = (undefined1  [16])0x0;
    local_ca8 = *(undefined1 (*) [16])(ng->d + 2);
    local_c98 = (undefined1  [16])0x0;
    uVar66 = secp256k1_ecmult_wnaf((int *)local_918,0x81,(secp256k1_scalar *)local_c88,0xf);
    uVar67 = secp256k1_ecmult_wnaf((int *)local_b28,0x81,(secp256k1_scalar *)local_ca8,0xf);
    if ((int)uVar79 < (int)uVar66) {
      uVar79 = uVar66;
    }
    if ((int)uVar79 < (int)uVar67) {
      uVar79 = uVar67;
    }
    local_d98 = (long)(int)uVar67;
    local_d90 = (long)(int)uVar66;
  }
  psVar72->infinity = 1;
  (psVar72->x).n[0] = 0;
  (psVar72->x).n[1] = 0;
  (psVar72->x).n[2] = 0;
  (psVar72->x).n[3] = 0;
  *(undefined1 (*) [16])((psVar72->x).n + 4) = (undefined1  [16])0x0;
  (psVar72->y).n[1] = 0;
  (psVar72->y).n[2] = 0;
  (psVar72->y).n[3] = 0;
  (psVar72->y).n[4] = 0;
  (psVar72->z).n[0] = 0;
  (psVar72->z).n[1] = 0;
  (psVar72->z).n[2] = 0;
  (psVar72->z).n[3] = 0;
  (psVar72->z).n[4] = 0;
  if (0 < (int)uVar79) {
    lVar81 = (ulong)uVar79 * 4;
    uVar75 = (ulong)uVar79;
    do {
      if (psVar72->infinity == 0) {
        secp256k1_gej_double(psVar72,psVar72);
      }
      else {
        psVar72->infinity = 1;
        (psVar72->x).n[0] = 0;
        (psVar72->x).n[1] = 0;
        (psVar72->x).n[2] = 0;
        (psVar72->x).n[3] = 0;
        *(undefined1 (*) [16])((psVar72->x).n + 4) = (undefined1  [16])0x0;
        (psVar72->y).n[1] = 0;
        (psVar72->y).n[2] = 0;
        (psVar72->y).n[3] = 0;
        (psVar72->y).n[4] = 0;
        (psVar72->z).n[0] = 0;
        (psVar72->z).n[1] = 0;
        (psVar72->z).n[2] = 0;
        (psVar72->z).n[3] = 0;
        (psVar72->z).n[4] = 0;
      }
      if ((char)local_da8 == '\0') {
        puVar78 = &local_2fc;
        psVar73 = local_2f8;
        lVar71 = local_da0;
        puVar62 = &local_da8;
        do {
          puVar80 = (undefined1 *)((long)puVar62 + 0x140);
          if (((long)uVar75 <= (long)(int)puVar78[-1]) &&
             (uVar79 = *(uint *)((long)puVar78 + lVar81 + -0x410), uVar79 != 0)) {
            if ((int)uVar79 < 1) {
              psVar74 = psVar73 + (~uVar79 >> 1);
              psVar76 = (secp256k1_ge *)local_d58;
              for (lVar70 = 0xb; lVar70 != 0; lVar70 = lVar70 + -1) {
                (psVar76->x).n[0] = (psVar74->x).n[0];
                psVar74 = (secp256k1_ge *)((long)psVar74 + ((ulong)bVar82 * -2 + 1) * 8);
                psVar76 = (secp256k1_ge *)((long)psVar76 + (ulong)bVar82 * -0x10 + 8);
              }
              local_d58._40_8_ = 0x3ffffbfffff0bc - local_d58._40_8_;
              local_d58._48_8_ = 0x3ffffffffffffc - local_d58._48_8_;
              lVar70 = local_d58._56_8_;
              lStack_d18 = 0x3ffffffffffffc - local_d58._64_8_;
              local_d58._56_8_ = 0x3ffffffffffffc - lVar70;
              local_d10 = 0x3fffffffffffc - local_d10;
            }
            else {
              psVar74 = psVar73 + (uVar79 - 1 >> 1);
              psVar76 = (secp256k1_ge *)local_d58;
              for (lVar70 = 0xb; lVar70 != 0; lVar70 = lVar70 + -1) {
                (psVar76->x).n[0] = (psVar74->x).n[0];
                psVar74 = (secp256k1_ge *)((long)psVar74 + ((ulong)bVar82 * -2 + 1) * 8);
                psVar76 = (secp256k1_ge *)((long)psVar76 + (ulong)bVar82 * -0x10 + 8);
              }
            }
            secp256k1_gej_add_ge_var
                      (local_d70,local_d70,(secp256k1_ge *)local_d58,(secp256k1_fe *)0x0);
          }
          if (((long)uVar75 <= (long)(int)*puVar78) &&
             (uVar79 = *(uint *)((long)puVar78 + lVar81 + -0x20c), uVar79 != 0)) {
            local_d08 = 0;
            if ((int)uVar79 < 1) {
              uVar68 = (ulong)(~uVar79 >> 1);
              local_d58._32_8_ = *(uint64_t *)((long)puVar62 + uVar68 * 0x28 + 0x160);
              local_d58._0_8_ = *(undefined8 *)(puVar80 + uVar68 * 0x28);
              local_d58._8_8_ = *(uint64_t *)((long)(puVar80 + uVar68 * 0x28) + 8);
              local_d58._16_8_ = *(uint64_t *)((long)puVar62 + uVar68 * 0x28 + 0x150);
              local_d58._24_8_ = ((uint64_t *)((long)puVar62 + uVar68 * 0x28 + 0x150))[1];
              puVar1 = psVar73[uVar68].y.n + 2;
              local_d58._40_8_ = 0x3ffffbfffff0bc - psVar73[uVar68].y.n[0];
              local_d58._48_8_ = 0x3ffffffffffffc - psVar73[uVar68].y.n[1];
              lStack_d18 = 0x3ffffffffffffc - puVar1[1];
              local_d58._56_8_ = 0x3ffffffffffffc - *puVar1;
              local_d10 = 0x3fffffffffffc - psVar73[uVar68].y.n[4];
            }
            else {
              uVar68 = (ulong)(uVar79 - 1 >> 1);
              local_d58._32_8_ = *(uint64_t *)((long)puVar62 + uVar68 * 0x28 + 0x160);
              local_d58._0_8_ = *(undefined8 *)(puVar80 + uVar68 * 0x28);
              local_d58._8_8_ = *(uint64_t *)((long)(puVar80 + uVar68 * 0x28) + 8);
              local_d58._16_8_ = *(uint64_t *)((long)puVar62 + uVar68 * 0x28 + 0x150);
              local_d58._24_8_ = ((uint64_t *)((long)puVar62 + uVar68 * 0x28 + 0x150))[1];
              local_d10 = psVar73[uVar68].y.n[4];
              local_d58._40_8_ = psVar73[uVar68].y.n[0];
              local_d58._48_8_ = psVar73[uVar68].y.n[1];
              unique0x00006c80 = *(undefined1 (*) [16])(psVar73[uVar68].y.n + 2);
            }
            secp256k1_gej_add_ge_var
                      (local_d70,local_d70,(secp256k1_ge *)local_d58,(secp256k1_fe *)0x0);
          }
          psVar73 = psVar73 + 8;
          puVar78 = puVar78 + 0x104;
          lVar71 = lVar71 + -1;
          puVar62 = (ulong *)puVar80;
        } while (lVar71 != 0);
      }
      psVar72 = local_d70;
      if (((long)uVar75 <= local_d90) &&
         (uVar79 = *(uint *)((long)local_918[0].x.n + uVar75 * 4 + -4), uVar79 != 0)) {
        if ((int)uVar79 < 1) {
          secp256k1_ge_from_storage((secp256k1_ge *)local_d58,secp256k1_pre_g + (~uVar79 >> 1));
          local_d58._40_8_ = 0x3ffffbfffff0bc - local_d58._40_8_;
          local_d58._48_8_ = 0x3ffffffffffffc - local_d58._48_8_;
          lVar71 = local_d58._56_8_;
          lStack_d18 = 0x3ffffffffffffc - local_d58._64_8_;
          local_d58._56_8_ = 0x3ffffffffffffc - lVar71;
          local_d10 = 0x3fffffffffffc - local_d10;
        }
        else {
          secp256k1_ge_from_storage((secp256k1_ge *)local_d58,secp256k1_pre_g + (uVar79 - 1 >> 1));
        }
        secp256k1_gej_add_zinv_var
                  (psVar72,psVar72,(secp256k1_ge *)local_d58,(secp256k1_fe *)local_cd8);
      }
      if (((long)uVar75 <= local_d98) &&
         (uVar79 = *(uint *)((long)local_b28[0].d + uVar75 * 4 + -4), uVar79 != 0)) {
        if ((int)uVar79 < 1) {
          secp256k1_ge_from_storage((secp256k1_ge *)local_d58,secp256k1_pre_g_128 + (~uVar79 >> 1));
          local_d58._40_8_ = 0x3ffffbfffff0bc - local_d58._40_8_;
          local_d58._48_8_ = 0x3ffffffffffffc - local_d58._48_8_;
          lVar71 = local_d58._56_8_;
          lStack_d18 = 0x3ffffffffffffc - local_d58._64_8_;
          local_d58._56_8_ = 0x3ffffffffffffc - lVar71;
          local_d10 = 0x3fffffffffffc - local_d10;
        }
        else {
          secp256k1_ge_from_storage
                    ((secp256k1_ge *)local_d58,secp256k1_pre_g_128 + (uVar79 - 1 >> 1));
        }
        secp256k1_gej_add_zinv_var
                  (psVar72,psVar72,(secp256k1_ge *)local_d58,(secp256k1_fe *)local_cd8);
      }
      lVar81 = lVar81 + -4;
      bVar5 = 1 < (long)uVar75;
      uVar75 = uVar75 - 1;
    } while (bVar5);
    if (psVar72->infinity == 0) {
      uVar75 = (psVar72->z).n[0];
      uVar68 = (psVar72->z).n[1];
      uVar2 = (psVar72->z).n[2];
      uVar3 = (psVar72->z).n[3];
      auVar83._8_8_ = 0;
      auVar83._0_8_ = local_cc0._0_8_;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = uVar75;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uStack_cc8;
      auVar37._8_8_ = 0;
      auVar37._0_8_ = uVar68;
      uVar4 = (psVar72->z).n[4];
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_cd8._8_8_;
      auVar38._8_8_ = 0;
      auVar38._0_8_ = uVar2;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_cd8._0_8_;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = uVar3;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_cc0._8_8_;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = uVar4;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = SUB168(auVar9 * auVar40,0);
      auVar7 = auVar6 * auVar37 + auVar83 * auVar36 + auVar7 * auVar38 + auVar8 * auVar39 +
               auVar10 * ZEXT816(0x1000003d10);
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_cc0._8_8_;
      auVar41._8_8_ = 0;
      auVar41._0_8_ = uVar75;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_cc0._0_8_;
      auVar42._8_8_ = 0;
      auVar42._0_8_ = uVar68;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = uStack_cc8;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = uVar2;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_cd8._8_8_;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = uVar3;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_cd8._0_8_;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = uVar4;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = SUB168(auVar9 * auVar40,8);
      auVar83 = auVar16 * ZEXT816(0x1000003d10000) +
                auVar15 * auVar45 + auVar14 * auVar44 + auVar13 * auVar43 + auVar12 * auVar42 +
                auVar11 * auVar41 + (auVar7 >> 0x34);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_cd8._0_8_;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = uVar75;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_cc0._8_8_;
      auVar47._8_8_ = 0;
      auVar47._0_8_ = uVar68;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = local_cc0._0_8_;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = uVar2;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = uStack_cc8;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = uVar3;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_cd8._8_8_;
      auVar50._8_8_ = 0;
      auVar50._0_8_ = uVar4;
      auVar84 = auVar21 * auVar50 + auVar20 * auVar49 + auVar19 * auVar48 + auVar18 * auVar47 +
                (auVar83 >> 0x34);
      auVar22._8_8_ = 0;
      auVar22._0_8_ = (auVar84._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar83._6_2_ & 0xf);
      auVar6 = auVar22 * ZEXT816(0x1000003d1) + auVar17 * auVar46;
      uVar69 = auVar6._0_8_;
      uVar77 = auVar6._8_8_;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = local_cd8._8_8_;
      auVar51._8_8_ = 0;
      auVar51._0_8_ = uVar75;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_cd8._0_8_;
      auVar52._8_8_ = 0;
      auVar52._0_8_ = uVar68;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = local_cc0._8_8_;
      auVar53._8_8_ = 0;
      auVar53._0_8_ = uVar2;
      auVar61._8_8_ = uVar77 >> 0x34;
      auVar61._0_8_ = uVar77 * 0x1000 | uVar69 >> 0x34;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = local_cc0._0_8_;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = uVar3;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = uStack_cc8;
      auVar55._8_8_ = 0;
      auVar55._0_8_ = uVar4;
      auVar84 = auVar25 * auVar53 + auVar27 * auVar55 + auVar26 * auVar54 + (auVar84 >> 0x34);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = auVar84._0_8_ & 0xfffffffffffff;
      auVar61 = auVar28 * ZEXT816(0x1000003d10) + auVar24 * auVar52 + auVar23 * auVar51 + auVar61;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = uStack_cc8;
      auVar56._8_8_ = 0;
      auVar56._0_8_ = uVar75;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = local_cd8._8_8_;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = uVar68;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = local_cd8._0_8_;
      auVar58._8_8_ = 0;
      auVar58._0_8_ = uVar2;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = local_cc0._8_8_;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = uVar3;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = local_cc0._0_8_;
      auVar60._8_8_ = 0;
      auVar60._0_8_ = uVar4;
      auVar84 = auVar33 * auVar60 + auVar32 * auVar59 + (auVar84 >> 0x34);
      (local_d70->z).n[0] = uVar69 & 0xfffffffffffff;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = auVar84._0_8_;
      (local_d70->z).n[1] = auVar61._0_8_ & 0xfffffffffffff;
      auVar6 = auVar34 * ZEXT816(0x1000003d10) +
               auVar31 * auVar58 + auVar29 * auVar56 + auVar30 * auVar57 + (auVar61 >> 0x34);
      auVar8 = auVar6 >> 0x34;
      auVar64._8_8_ = 0;
      auVar64._0_8_ = auVar8._0_8_;
      (local_d70->z).n[2] = auVar6._0_8_ & 0xfffffffffffff;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = auVar84._8_8_;
      auVar63._8_8_ = auVar8._8_8_;
      auVar63._0_8_ = auVar7._0_8_ & 0xfffffffffffff;
      auVar64 = auVar35 * ZEXT816(0x1000003d10000) + auVar63 + auVar64;
      uVar75 = auVar64._0_8_;
      (local_d70->z).n[3] = uVar75 & 0xfffffffffffff;
      (local_d70->z).n[4] =
           (auVar64._8_8_ << 0xc | uVar75 >> 0x34) + (auVar83._0_8_ & 0xffffffffffff);
    }
  }
  return;
}

Assistant:

static void secp256k1_ecmult(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_scalar *na, const secp256k1_scalar *ng) {
    secp256k1_fe aux[ECMULT_TABLE_SIZE(WINDOW_A)];
    secp256k1_ge pre_a[ECMULT_TABLE_SIZE(WINDOW_A)];
    struct secp256k1_strauss_point_state ps[1];
    struct secp256k1_strauss_state state;

    state.aux = aux;
    state.pre_a = pre_a;
    state.ps = ps;
    secp256k1_ecmult_strauss_wnaf(&state, r, 1, a, na, ng);
}